

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O2

void open_sockets(sender *s,string *host)

{
  int iVar1;
  io_buf *this;
  
  iVar1 = open_socket((host->_M_dataplus)._M_p);
  s->sd = iVar1;
  this = (io_buf *)operator_new(0xa8);
  io_buf::io_buf(this);
  s->buf = this;
  v_array<int>::push_back(&this->files,&s->sd);
  return;
}

Assistant:

void open_sockets(sender& s, string host)
{
  s.sd = open_socket(host.c_str());
  s.buf = new io_buf();
  s.buf->files.push_back(s.sd);
}